

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult * __thiscall
testing::internal::CmpHelperEQ<std::__cxx11::string,char[9]>
          (AssertionResult *__return_storage_ptr__,internal *this,char *lhs_expression,
          char *rhs_expression,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs,char (*rhs) [9])

{
  bool bVar1;
  char (*rhs_local) [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs_local;
  char *rhs_expression_local;
  char *lhs_expression_local;
  
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          rhs_expression,(char *)lhs);
  if (bVar1) {
    testing::AssertionSuccess();
  }
  else {
    CmpHelperEQFailure<std::__cxx11::string,char[9]>
              (__return_storage_ptr__,this,lhs_expression,rhs_expression,lhs,rhs);
  }
  return __return_storage_ptr__;
}

Assistant:

AssertionResult CmpHelperEQ(const char* lhs_expression,
                            const char* rhs_expression,
                            const T1& lhs,
                            const T2& rhs) {
  if (lhs == rhs) {
    return AssertionSuccess();
  }

  return CmpHelperEQFailure(lhs_expression, rhs_expression, lhs, rhs);
}